

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O2

void wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
     doVisitLocalGet(CoalesceLocals *self,Expression **currp)

{
  BasicBlock *pBVar1;
  LocalGet *curr;
  Block *pBVar2;
  initializer_list<wasm::Expression_*> local_48;
  Expression *local_38;
  Expression **local_30;
  Expression **currp_local;
  Builder builder;
  
  local_30 = currp;
  curr = Expression::cast<wasm::LocalGet>(*currp);
  pBVar1 = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .currBasicBlock;
  if (pBVar1 == (BasicBlock *)0x0) {
    currp_local = (Expression **)
                  (self->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .
                  super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                  .
                  super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .
                  super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
                  currModule;
    pBVar2 = (Block *)Builder::replaceWithIdenticalType<wasm::LocalGet>
                                ((Builder *)&currp_local,curr);
    if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
        LocalGetId) {
      local_38 = (Expression *)
                 MixedArena::alloc<wasm::Unreachable>((MixedArena *)(currp_local + 0x2b));
      local_48._M_array = &local_38;
      local_48._M_len = 1;
      pBVar2 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                         ((Builder *)&currp_local,&local_48,
                          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                super_Expression.type.id);
    }
    *currp = (Expression *)pBVar2;
  }
  else {
    local_48._M_array = (iterator)((ulong)local_48._M_array._4_4_ << 0x20);
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               &(pBVar1->contents).actions,(What *)&local_48,&curr->index,&local_30);
  }
  return;
}

Assistant:

static void doVisitLocalGet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalGet>();
    // if in unreachable code, ignore
    if (!self->currBasicBlock) {
      Builder builder(*self->getModule());
      auto* rep = builder.replaceWithIdenticalType(curr);
      if (rep->is<LocalGet>()) {
        // We failed to replace the node with something simpler. This can happen
        // if the local is non-nullable, for example. We still need to remove
        // this node entirely, however, as it is unreachable and so we will not
        // see it in the analysis we perform (for example, we may be changing
        // local indexes). Replace it with something completely different, even
        // if it is larger, a block with a forced type that has unreachable
        // contents,
        //
        //  (block (result X)
        //   (unreachable))
        //
        // That pattern lets us set any type we wish.
        //
        // TODO: Make a helper function for this, if it is useful in other
        //       places.
        rep = builder.makeBlock({builder.makeUnreachable()}, curr->type);
      }
      *currp = rep;
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Get, curr->index, currp);
  }